

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::Fill
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint8_t value)

{
  byte bVar1;
  uint uVar2;
  uchar *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  ulong uVar7;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image,x,y,width,height);
  bVar1 = image->_colorCount;
  uVar6 = width * bVar1;
  uVar2 = image->_rowSize;
  if (uVar2 == uVar6) {
    uVar5 = height;
    uVar4 = 1;
    if (uVar6 < (uint)(0xffffffff / (ulong)height)) {
      uVar5 = 1;
      uVar4 = height;
    }
    height = uVar5;
    uVar6 = uVar6 * uVar4;
  }
  if (height * uVar2 != 0) {
    puVar3 = image->_data;
    uVar7 = 0;
    do {
      memset(puVar3 + uVar7 + (ulong)(bVar1 * x) + (ulong)(y * uVar2),(uint)value,(ulong)uVar6);
      uVar7 = uVar7 + uVar2;
    } while (height * uVar2 != uVar7);
  }
  return;
}

Assistant:

void Fill( Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint8_t value )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();
        width = width * colorCount;

        OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        uint8_t * imageY = image.data() + y * rowSize + x * colorCount;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize )
            memset( imageY, value, sizeof( uint8_t ) * width );
    }